

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::SetIntensityBinIDs(ValidateVulnerability *this)

{
  int iVar1;
  mapped_type *pmVar2;
  iterator __position;
  size_type sVar3;
  _Rb_tree_const_iterator<int> local_30;
  iterator itIntHint;
  iterator itVulHint;
  ValidateVulnerability *this_local;
  
  pmVar2 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id);
  __position = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pmVar2);
  pmVar2 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id);
  itIntHint = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        (pmVar2,__position._M_node,&(this->v_).intensity_bin_id);
  local_30._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->intensityBinIDs_);
  iVar1 = (this->v_).intensity_bin_id;
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&this->intensityBinIDs_);
  if ((int)sVar3 < iVar1) {
    local_30._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->intensityBinIDs_);
  }
  else {
    local_30._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->intensityBinIDs_);
    std::advance<std::_Rb_tree_const_iterator<int>,int>(&local_30,(this->v_).intensity_bin_id);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            (&this->intensityBinIDs_,(const_iterator)local_30._M_node,&(this->v_).intensity_bin_id);
  return;
}

Assistant:

inline void ValidateVulnerability::SetIntensityBinIDs() {
/* Fill sets with intensity bin IDs used in check at end to establish that
 * each vulnerability ID has entries for all intensity bin IDs. This check is
 * only relevant in single peril models, and can be supressed by the user
 * through a command line argument. */

  std::set<int>::iterator itVulHint = vulIDToIntBinIDs_[v_.vulnerability_id].end();
  vulIDToIntBinIDs_[v_.vulnerability_id].insert(itVulHint, v_.intensity_bin_id);

  std::set<int>::iterator itIntHint = intensityBinIDs_.begin();
  if (v_.intensity_bin_id > (int)intensityBinIDs_.size()) {
    itIntHint = intensityBinIDs_.end();
  } else {
    itIntHint = intensityBinIDs_.begin();
    std::advance(itIntHint, v_.intensity_bin_id);
  }
  intensityBinIDs_.insert(itIntHint, v_.intensity_bin_id);

}